

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  size_t *psVar1;
  SymbolsByNameSet *this_00;
  __node_base *p_Var2;
  size_type *psVar3;
  pointer *ppRVar4;
  pointer *ppCVar5;
  int iVar6;
  pointer ppcVar7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  pointer ppVar10;
  Block *pBVar11;
  LogMessage *pLVar12;
  pointer pCVar13;
  __hash_code __code;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  ulong __bkt;
  ulong uVar16;
  long lVar17;
  Symbol *__k;
  __buckets_ptr pp_Var18;
  Block *pBVar19;
  pointer pRVar20;
  ulong uVar21;
  StringPiece local_88;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_78;
  QueryKey name;
  
  pCVar13 = (this->checkpoints_).
            super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_start == pCVar13) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&name,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x577);
    pLVar12 = internal::LogMessage::operator<<
                        ((LogMessage *)&name,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar12);
    internal::LogMessage::~LogMessage((LogMessage *)&name);
    pCVar13 = (this->checkpoints_).
              super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar21 = (ulong)pCVar13[-1].pending_symbols_before_checkpoint;
  local_78 = &this->symbols_after_checkpoint_;
  this_00 = &this->symbols_by_name_;
  p_Var2 = &(this->symbols_by_name_)._M_h._M_before_begin;
  do {
    ppcVar7 = (this->symbols_after_checkpoint_).
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->symbols_after_checkpoint_).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppcVar7 >> 3) <= uVar21) {
      for (uVar21 = (ulong)pCVar13[-1].pending_files_before_checkpoint;
          ppcVar7 = (this->files_after_checkpoint_).
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar21 < (ulong)((long)(this->files_after_checkpoint_).
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar7 >> 3);
          uVar21 = uVar21 + 1) {
        stringpiece_internal::StringPiece::StringPiece((StringPiece *)&name,ppcVar7[uVar21]);
        std::
        _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&(this->files_by_name_)._M_h,&name);
      }
      uVar21 = (ulong)pCVar13[-1].pending_extensions_before_checkpoint;
      lVar17 = uVar21 << 4;
      for (; ppVar10 = (this->extensions_after_checkpoint_).
                       super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
          uVar21 < (ulong)((long)(this->extensions_after_checkpoint_).
                                 super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 4);
          uVar21 = uVar21 + 1) {
        std::
        _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
        ::erase(&(this->extensions_)._M_t,(key_type *)((long)&ppVar10->first + lVar17));
        lVar17 = lVar17 + 0x10;
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                (local_78,(long)pCVar13[-1].pending_symbols_before_checkpoint);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                (&this->files_after_checkpoint_,(long)pCVar13[-1].pending_files_before_checkpoint);
      std::
      vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
      ::resize(&this->extensions_after_checkpoint_,
               (long)pCVar13[-1].pending_extensions_before_checkpoint);
      iVar6 = pCVar13[-1].arena_before_checkpoint;
      uVar21 = (this->arena_).num_allocations_;
      while ((ulong)(long)iVar6 < uVar21) {
        pRVar20 = (this->arena_).rollback_info_.
                  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->arena_).rollback_info_.
            super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
            ._M_impl.super__Vector_impl_data._M_start == pRVar20) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&name,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x303);
          pLVar12 = internal::LogMessage::operator<<
                              ((LogMessage *)&name,"CHECK failed: !rollback_info_.empty(): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar12);
          internal::LogMessage::~LogMessage((LogMessage *)&name);
          pRVar20 = (this->arena_).rollback_info_.
                    super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        pBVar19 = pRVar20[-1].block;
        (anonymous_namespace)::TableArena::
        VisitAlloc<google::protobuf::(anonymous_namespace)::TableArena::DestroyVisitor,google::protobuf::(anonymous_namespace)::TableArena::OutOfLineAlloc,std::__cxx11::string,std::array<std::__cxx11::string,2ul>,std::array<std::__cxx11::string,3ul>,std::array<std::__cxx11::string,4ul>,std::array<std::__cxx11::string,5ul>,google::protobuf::FileDescriptorTables,google::protobuf::SourceCodeInfo,google::protobuf::FileOptions,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions>
                  (pBVar19 + 1,pBVar19,&pBVar19->end_offset);
        psVar1 = &pRVar20[-1].count;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          ppRVar4 = &(this->arena_).rollback_info_.
                     super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppRVar4 = *ppRVar4 + -1;
        }
        uVar21 = (this->arena_).num_allocations_ - 1;
        (this->arena_).num_allocations_ = uVar21;
      }
      name._0_8_ = (this->arena_).current_;
      name.name.ptr_ = (char *)(this->arena_).full_blocks_;
      name.name.length_ = (size_type)(this->arena_).small_size_blocks_._M_elems[0];
      name.parent = (this->arena_).small_size_blocks_._M_elems[1];
      name._32_8_ = (this->arena_).small_size_blocks_._M_elems[2];
      (this->arena_).full_blocks_ = (Block *)0x0;
      (this->arena_).current_ = (Block *)0x0;
      for (lVar17 = 0; lVar17 != 0x30; lVar17 = lVar17 + 8) {
        *(undefined8 *)((long)(this->arena_).small_size_blocks_._M_elems + lVar17) = 0;
      }
      for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 8) {
        pBVar19 = *(Block **)(&name.super_SymbolBase + lVar17);
        while (pBVar19 != (Block *)0x0) {
          pBVar11 = pBVar19->next;
          if (pBVar19->start_offset == 0) {
            operator_delete(pBVar19);
            pBVar19 = pBVar11;
          }
          else {
            anon_unknown_1::TableArena::RelocateToUsedList(&this->arena_,pBVar19);
            pBVar19 = pBVar11;
          }
        }
      }
      ppCVar5 = &(this->checkpoints_).
                 super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar5 = *ppCVar5 + -1;
      return;
    }
    name.name.ptr_ = (char *)0x0;
    name.name.length_ = 0;
    __k = (Symbol *)ppcVar7[uVar21];
    stringpiece_internal::StringPiece::StringPiece(&local_88,(char *)__k);
    name.name.ptr_ = local_88.ptr_;
    name.name.length_ = local_88.length_;
    local_88.ptr_ = (char *)&name;
    name.super_SymbolBase.symbol_type_ = '\n';
    __code = std::__detail::
             _Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
             ::_M_hash_code((_Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                             *)&local_88,__k);
    __bkt = __code % (this->symbols_by_name_)._M_h._M_bucket_count;
    p_Var14 = std::
              _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::_M_find_before_node(&this_00->_M_h,__bkt,(key_type *)&local_88,__code);
    if (p_Var14 != (__node_base_ptr)0x0) {
      p_Var8 = p_Var14->_M_nxt;
      pp_Var18 = (this_00->_M_h)._M_buckets;
      p_Var9 = p_Var8->_M_nxt;
      if (pp_Var18[__bkt] == p_Var14) {
        p_Var15 = p_Var14;
        if (p_Var9 != (_Hash_node_base *)0x0) {
          uVar16 = (ulong)p_Var9[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count;
          if (uVar16 == __bkt) goto LAB_0035658b;
          pp_Var18[uVar16] = pp_Var18[__bkt];
          pp_Var18 = (this_00->_M_h)._M_buckets;
          p_Var15 = pp_Var18[__bkt];
        }
        if (p_Var2 == p_Var15) {
          p_Var2->_M_nxt = p_Var9;
        }
        pp_Var18[__bkt] = (__node_base_ptr)0x0;
      }
      else if ((p_Var9 != (_Hash_node_base *)0x0) &&
              (uVar16 = (ulong)p_Var9[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count,
              uVar16 != __bkt)) {
        pp_Var18[uVar16] = p_Var14;
      }
LAB_0035658b:
      p_Var14->_M_nxt = p_Var8->_M_nxt;
      operator_delete(p_Var8);
      psVar3 = &(this->symbols_by_name_)._M_h._M_element_count;
      *psVar3 = *psVar3 - 1;
    }
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (size_t i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size(); i++) {
    Symbol::QueryKey name;
    name.name = symbols_after_checkpoint_[i];
    symbols_by_name_.erase(Symbol(&name));
  }
  for (size_t i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size(); i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (size_t i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size(); i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  arena_.RollbackTo(checkpoint.arena_before_checkpoint);
  checkpoints_.pop_back();
}